

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

void __thiscall MppMetaService::~MppMetaService(MppMetaService *this)

{
  list_head *plVar1;
  list_head *plVar2;
  list_head *plVar3;
  
  plVar1 = &this->mlist_meta;
  if ((this->mlist_meta).next != plVar1) {
    _mpp_log_l(4,"mpp_meta","cleaning leaked metadata\n","~MppMetaService");
    plVar3 = plVar1->next;
    while (plVar3 != plVar1) {
      plVar2 = plVar3->next;
      put_meta(this,(MppMetaImpl *)(plVar3 + -3));
      plVar3 = plVar2;
    }
  }
  if (this->mTrie != (MppTrie)0x0) {
    mpp_trie_deinit(this->mTrie);
    this->mTrie = (MppTrie)0x0;
  }
  if (this->meta_count != 0) {
    _mpp_log_l(2,"mpp_meta","Assertion %s failed at %s:%d\n",(char *)0x0,"meta_count == 0",
               "~MppMetaService",0xad);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  this->finished = 1;
  return;
}

Assistant:

MppMetaService::~MppMetaService()
{
    if (!list_empty(&mlist_meta)) {
        MppMetaImpl *pos, *n;

        mpp_log_f("cleaning leaked metadata\n");

        list_for_each_entry_safe(pos, n, &mlist_meta, MppMetaImpl, list_meta) {
            put_meta(pos);
        }
    }

    if (mTrie) {
        mpp_trie_deinit(mTrie);
        mTrie = NULL;
    }

    mpp_assert(meta_count == 0);
    finished = 1;
}